

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall fmp4_stream::box::print(box *this)

{
  long lVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=================",0x11)
  ;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->box_type_)._M_dataplus._M_p,
                      (this->box_type_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"==================",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  lVar1 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," box size: ",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void box::print() const
	{
		std::cout << "=================" << box_type_ << "==================" << std::endl;
		std::cout << std::setw(33) << std::left << " box size: " << size_ << std::endl;
	}